

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O3

void __thiscall helics::helicsCLI11App::add_callback(helicsCLI11App *this,function<void_()> *cback)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if ((this->cbacks).
      super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->cbacks).
      super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_38._8_8_ = 0;
    local_20 = CLI::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/helicsCLI11.hpp:140:22)>
               ::_M_invoke;
    local_28 = CLI::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/helicsCLI11.hpp:140:22)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    CLI::std::function<void_()>::operator=
              ((function<void_()> *)
               ((long)&(this->super_App).parse_complete_callback_.super__Function_base._M_functor +
               (ulong)(((this->super_App).immediate_callback_ ^ 1) << 5)),
               (function<void_()> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)&this->cbacks,
             cback);
  return;
}

Assistant:

void add_callback(std::function<void()> cback)
    {
        if (cbacks.empty()) {
            callback([this]() {
                for (auto& cb : cbacks) {
                    cb();
                }
            });
        }
        cbacks.push_back(std::move(cback));
    }